

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex<short[1]>
          (Simplex_tree<MiniSTOptions> *this,short (*simplex) [1],Filtration_value *filtration)

{
  undefined8 extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar1;
  vector<short,_std::allocator<short>_> copy;
  allocator_type local_39;
  _Vector_base<short,_std::allocator<short>_> local_38;
  
  std::vector<short,std::allocator<short>>::vector<short_const*,void>
            ((vector<short,std::allocator<short>> *)&local_38,(short *)filtration,
             (short *)((long)filtration + 2),&local_39);
  std::
  __sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_38._M_impl.super__Vector_impl_data._M_start,
             local_38._M_impl.super__Vector_impl_data._M_finish);
  insert_simplex_raw<std::vector<short,std::allocator<short>>>
            (this,(vector<short,_std::allocator<short>_> *)simplex,(Filtration_value *)&local_38);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_38);
  pVar1._8_8_ = extraout_RDX;
  pVar1.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar1;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }